

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_reg_alloc_start(TCGContext_conflict9 *s)

{
  int iVar1;
  TCGTemp *pTVar2;
  uint uVar3;
  TCGTemp *ts;
  int n;
  int i;
  TCGContext_conflict9 *s_local;
  
  ts._4_4_ = 0;
  iVar1 = s->nb_globals;
  for (; ts._4_4_ < iVar1; ts._4_4_ = ts._4_4_ + 1) {
    pTVar2 = s->temps + ts._4_4_;
    uVar3 = 2;
    if (((undefined1  [56])*pTVar2 & (undefined1  [56])0x100000000) != (undefined1  [56])0x0) {
      uVar3 = 1;
    }
    *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xffffffffffff00ff | (ulong)uVar3 << 8;
  }
  iVar1 = s->nb_temps;
  for (; ts._4_4_ < iVar1; ts._4_4_ = ts._4_4_ + 1) {
    pTVar2 = s->temps + ts._4_4_;
    uVar3 = 0;
    if (((uint)(*(ulong *)pTVar2 >> 0x26) & 1) != 0) {
      uVar3 = 2;
    }
    *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xffffffffffff00ff | (ulong)uVar3 << 8;
    *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xffffffefffffffff;
    *(ulong *)pTVar2 = *(ulong *)pTVar2 & 0xfffffffeffffffff;
  }
  memset(s->reg_to_temp,0,0x100);
  return;
}

Assistant:

static void tcg_reg_alloc_start(TCGContext *s)
{
    int i, n;
    TCGTemp *ts;

    for (i = 0, n = s->nb_globals; i < n; i++) {
        ts = &s->temps[i];
        ts->val_type = (ts->fixed_reg ? TEMP_VAL_REG : TEMP_VAL_MEM);
    }
    for (n = s->nb_temps; i < n; i++) {
        ts = &s->temps[i];
        ts->val_type = (ts->temp_local ? TEMP_VAL_MEM : TEMP_VAL_DEAD);
        ts->mem_allocated = 0;
        ts->fixed_reg = 0;
    }

    memset(s->reg_to_temp, 0, sizeof(s->reg_to_temp));
}